

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_mul_n_by_m_template.h
# Opt level: O2

bool __thiscall
test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int>::do_test
          (test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int> *this,
          size_t rounds)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  size_t i;
  size_t sVar4;
  
  bVar3 = true;
  for (sVar4 = 0; rounds != sVar4; sVar4 = sVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "initialize()       boost compare with uintwide_t: round ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[3])(this);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mul()  boost compare with uintwide_t: round ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,",  digits2: ");
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[2])(this);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = test_binary_mul(this);
    bVar3 = (bool)(bVar3 & bVar1);
  }
  return bVar3;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);
      }

      return result_is_ok;
    }